

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QList<QModelIndex> * __thiscall
QListModeViewBase::intersectingSet
          (QList<QModelIndex> *__return_storage_ptr__,QListModeViewBase *this,QRect *area)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  QListViewPrivate *pQVar4;
  QAbstractItemModel *pQVar5;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_01;
  int iVar6;
  Representation *pRVar7;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  QRect *pQVar13;
  int iVar14;
  int iVar15;
  QRect *pQVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  Bucket BVar21;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (((this->super_QCommonListViewBase).dd)->flow == LeftToRight) {
    pQVar16 = (QRect *)&area->y1;
    pRVar7 = &area->y2;
    lVar10 = 8;
    pQVar13 = area;
  }
  else {
    pRVar7 = &area->x2;
    lVar10 = 0xc;
    pQVar13 = (QRect *)&area->y1;
    pQVar16 = area;
  }
  uVar20 = (this->segmentPositions).d.size;
  if ((1 < uVar20) && ((this->flowPositions).d.size != 0)) {
    iVar1 = (pQVar16->x1).m_i;
    iVar6 = (int)uVar20;
    iVar19 = iVar6 + -1;
    iVar14 = iVar6 >> 1;
    if (0 < iVar19) {
      iVar15 = iVar19;
      iVar17 = 0;
      do {
        iVar18 = iVar14;
        if (iVar1 < (this->segmentPositions).d.ptr[iVar14]) {
          iVar15 = iVar14 + -1;
          iVar18 = iVar17;
        }
        iVar14 = iVar15 + iVar18 + 1 >> 1;
        iVar17 = iVar18;
      } while (iVar18 < iVar15);
    }
    if (iVar14 <= iVar6 + -2) {
      iVar15 = *(int *)((long)&(area->x1).m_i + lVar10);
      iVar17 = (pQVar13->x1).m_i;
      iVar18 = pRVar7->m_i;
      lVar10 = (long)iVar14;
      do {
        if (iVar18 < (this->segmentPositions).d.ptr[lVar10]) break;
        piVar3 = (this->segmentStartRows).d.ptr;
        piVar11 = piVar3 + lVar10 + 1;
        if (iVar6 + -2 <= lVar10) {
          piVar11 = &(this->super_QCommonListViewBase).batchStartRow;
        }
        if (iVar17 <= (this->segmentExtents).d.ptr[lVar10]) {
          iVar14 = piVar3[lVar10];
          iVar2 = *piVar11;
          iVar12 = iVar2 + -1;
          iVar9 = iVar2 + iVar14 >> 1;
          if (iVar14 < iVar12) {
            do {
              if (iVar17 < (this->flowPositions).d.ptr[iVar9]) {
                iVar12 = iVar9 + -1;
                iVar9 = iVar14;
              }
              iVar14 = iVar9;
              iVar9 = iVar12 + iVar14 + 1 >> 1;
            } while (iVar14 < iVar12);
          }
          if (iVar9 < iVar2) {
            uVar20 = (ulong)iVar9;
            do {
              if (iVar15 < (this->flowPositions).d.ptr[uVar20]) break;
              pQVar4 = (this->super_QCommonListViewBase).dd;
              local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
              local_78 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
              pQVar5 = (pQVar4->super_QAbstractItemViewPrivate).model;
              QPersistentModelIndex::operator_cast_to_QModelIndex
                        ((QModelIndex *)&local_58,&(pQVar4->super_QAbstractItemViewPrivate).root);
              (**(code **)(*(long *)pQVar5 + 0x60))
                        (&local_78,pQVar5,uVar20 & 0xffffffff,0,(QModelIndex *)&local_58);
              local_48.ptr = local_68.ptr;
              local_58 = local_78;
              puStack_50 = puStack_70;
              this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                          **)(*(long *)((pQVar4->super_QAbstractItemViewPrivate).model + 8) + 0x90);
              if (this_00 ==
                  (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                   *)0x0) {
LAB_00571c70:
                local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
                local_78 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
                pQVar4 = (this->super_QCommonListViewBase).dd;
                pQVar5 = (pQVar4->super_QAbstractItemViewPrivate).model;
                iVar14 = pQVar4->column;
                QPersistentModelIndex::operator_cast_to_QModelIndex
                          ((QModelIndex *)&local_58,&(pQVar4->super_QAbstractItemViewPrivate).root);
                (**(code **)(*(long *)pQVar5 + 0x60))
                          (&local_78,pQVar5,uVar20 & 0xffffffff,iVar14,(QModelIndex *)&local_58);
                if (((-1 < (int)local_78) && (-1 < (long)local_78)) &&
                   (local_68.ptr != (QAbstractItemModel *)0x0)) {
                  pQVar4 = (this->super_QCommonListViewBase).dd;
                  if ((pQVar4->flow != LeftToRight) &&
                     ((pQVar4->itemAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                      super_QFlagsStorage<Qt::AlignmentFlag>.i != 0)) {
                    local_58 = &DAT_aaaaaaaaaaaaaaaa;
                    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
                    local_48.ptr._0_4_ = 0xaaaaaaaa;
                    (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[3])
                              ((QModelIndex *)&local_58,this,&local_78);
                    piVar3 = (this->segmentPositions).d.ptr;
                    iVar14 = piVar3[lVar10];
                    iVar9 = piVar3[lVar10 + 1];
                    if (iVar14 < iVar1) {
                      iVar14 = iVar1;
                    }
                    if (iVar18 <= iVar9) {
                      iVar9 = iVar18;
                    }
                    if ((iVar9 < (int)local_58) || ((int)local_58 + (short)puStack_50 <= iVar14))
                    goto LAB_00571d6f;
                  }
                  QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                            ((QMovableArrayOps<QModelIndex> *)__return_storage_ptr__,
                             (__return_storage_ptr__->d).size,(QModelIndex *)&local_78);
                  QList<QModelIndex>::end(__return_storage_ptr__);
                }
              }
              else {
                BVar21 = QHashPrivate::
                         Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                         ::findBucket<QtPrivate::QModelIndexWrapper>
                                   (this_00,(QModelIndexWrapper *)&local_58);
                if ((BVar21.span[BVar21.index] == (Span)0xff) ||
                   (*(long *)(BVar21.span + 0x80) == 0)) goto LAB_00571c70;
                QPersistentModelIndex::QPersistentModelIndex
                          ((QPersistentModelIndex *)&local_58,(QModelIndex *)&local_78);
                this_01 = (pQVar4->hiddenRows).q_hash.d;
                if (this_01 ==
                    (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
                  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                  goto LAB_00571c70;
                }
                pNVar8 = QHashPrivate::
                         Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                         findNode<QPersistentModelIndex>(this_01,(QPersistentModelIndex *)&local_58)
                ;
                QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
                if (pNVar8 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0)
                goto LAB_00571c70;
              }
LAB_00571d6f:
              uVar20 = uVar20 + 1;
            } while ((long)iVar2 != uVar20);
          }
        }
        lVar10 = lVar10 + 1;
      } while (iVar19 != (int)lVar10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QModelIndex> QListModeViewBase::intersectingSet(const QRect &area) const
{
    QList<QModelIndex> ret;
    int segStartPosition;
    int segEndPosition;
    int flowStartPosition;
    int flowEndPosition;
    if (flow() == QListView::LeftToRight) {
        segStartPosition = area.top();
        segEndPosition = area.bottom();
        flowStartPosition = area.left();
        flowEndPosition = area.right();
    } else {
        segStartPosition = area.left();
        segEndPosition = area.right();
        flowStartPosition = area.top();
        flowEndPosition = area.bottom();
    }
    if (segmentPositions.size() < 2 || flowPositions.isEmpty())
        return ret;
    // the last segment position is actually the edge of the last segment
    const int segLast = segmentPositions.size() - 2;
    int seg = qBinarySearch<int>(segmentPositions, segStartPosition, 0, segLast + 1);
    for (; seg <= segLast && segmentPositions.at(seg) <= segEndPosition; ++seg) {
        int first = segmentStartRows.at(seg);
        int last = (seg < segLast ? segmentStartRows.at(seg + 1) : batchStartRow) - 1;
        if (segmentExtents.at(seg) < flowStartPosition)
            continue;
        int row = qBinarySearch<int>(flowPositions, flowStartPosition, first, last);
        for (; row <= last && flowPositions.at(row) <= flowEndPosition; ++row) {
            if (isHidden(row))
                continue;
            QModelIndex index = modelIndex(row);
            if (index.isValid()) {
                if (flow() == QListView::LeftToRight || dd->itemAlignment == Qt::Alignment()) {
                    ret += index;
                } else {
                    const auto viewItem = indexToListViewItem(index);
                    const int iw = viewItem.width();
                    const int startPos = qMax(segStartPosition, segmentPositions.at(seg));
                    const int endPos = qMin(segmentPositions.at(seg + 1), segEndPosition);
                    if (endPos >= viewItem.x && startPos < viewItem.x + iw)
                        ret += index;
                }
            }
#if 0 // for debugging
            else
                qWarning("intersectingSet: row %d was invalid", row);
#endif
        }
    }
    return ret;
}